

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void output_bits_flush(_output_ctx *ctx)

{
  output_byte(ctx,(uchar)ctx->bitbuf);
  if ((ctx->bitbuf & 0x100) != 0) {
    output_byte(ctx,'\x01');
  }
  if (~LOG_FATAL < G_log_level) {
    G_log_log_level = LOG_DUMP;
    log_log_default("bitstream flushed 0x%02X\n",(ulong)(byte)ctx->bitbuf);
  }
  ctx->bitbuf = 1;
  return;
}

Assistant:

void output_bits_flush(output_ctx ctx)  /* IN/OUT */
{
    /* flush the bitbuf including
     * the extra 1 bit acting as eob flag */
    output_byte(ctx, (unsigned char) (ctx->bitbuf & 0xFF));
    if (ctx->bitbuf & 0x100)
    {
        output_byte(ctx, 1);
    }
    LOG(LOG_DUMP, ("bitstream flushed 0x%02X\n", ctx->bitbuf & 0xFF));

    /* reset it */
    ctx->bitbuf = 1;
}